

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_sampler_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  SPIRCombinedImageSampler *pSVar1;
  long lVar2;
  uint32_t id_00;
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  
  pSVar1 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>((Compiler *)this,id);
  if (pSVar1 != (SPIRCombinedImageSampler *)0x0) {
    id = (pSVar1->image).id;
  }
  CompilerGLSL::to_expression_abi_cxx11_(&expr,&this->super_CompilerGLSL,id,true);
  id_00 = 0;
  lVar2 = ::std::__cxx11::string::find((char)&expr,0x5b);
  if (pSVar1 == (SPIRCombinedImageSampler *)0x0) {
    if (lVar2 != -1) goto LAB_002f5503;
  }
  else {
    id_00 = (pSVar1->sampler).id;
    if (lVar2 != -1) {
LAB_002f5503:
      ::std::__cxx11::string::substr((ulong)&image_expr,(ulong)&expr);
      ::std::__cxx11::string::substr((ulong)&array_expr,(ulong)&expr);
      if (id_00 == 0) {
        ::std::operator+(&local_90,&image_expr,&this->sampler_name_suffix);
        ::std::operator+(__return_storage_ptr__,&local_90,&array_expr);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        CompilerGLSL::to_expression_abi_cxx11_
                  (__return_storage_ptr__,&this->super_CompilerGLSL,id_00,true);
      }
      ::std::__cxx11::string::~string((string *)&array_expr);
      ::std::__cxx11::string::~string((string *)&image_expr);
      goto LAB_002f55a6;
    }
    if (id_00 != 0) {
      CompilerGLSL::to_expression_abi_cxx11_
                (__return_storage_ptr__,&this->super_CompilerGLSL,id_00,true);
      goto LAB_002f55a6;
    }
  }
  ::std::operator+(__return_storage_ptr__,&expr,&this->sampler_name_suffix);
LAB_002f55a6:
  ::std::__cxx11::string::~string((string *)&expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_sampler_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);
	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	uint32_t samp_id = 0;
	if (combined)
		samp_id = combined->sampler;

	if (index == string::npos)
		return samp_id ? to_expression(samp_id) : expr + sampler_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return samp_id ? to_expression(samp_id) : (image_expr + sampler_name_suffix + array_expr);
	}
}